

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintCharsAsStringTo<wchar_t>(wchar_t *begin,size_t len,ostream *os)

{
  wchar_t c;
  int iVar1;
  CharFormat CVar2;
  uchar low_byte;
  size_t sVar3;
  bool bVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"L\"",2);
  if (len != 0) {
    bVar4 = false;
    sVar3 = 0;
    do {
      c = begin[sVar3];
      if ((bool)((uint)c < 0x100 & bVar4)) {
        iVar1 = isxdigit(c);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\" ",2);
          std::__ostream_insert<char,std::char_traits<char>>(os,"L\"",2);
        }
      }
      CVar2 = PrintAsStringLiteralTo(c,os);
      bVar4 = CVar2 == kHexEscape;
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return;
}

Assistant:

static void PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}